

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quaternion.hpp
# Opt level: O3

void __thiscall
OpenMD::Quaternion<double>::toTwistSwing(Quaternion<double> *this,double *tw,double *sx,double *sy)

{
  double __x;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double local_38;
  double dStack_30;
  
  dVar1 = (this->super_Vector<double,_4U>).data_[0];
  dVar6 = (this->super_Vector<double,_4U>).data_[3];
  if ((1e-06 <= ABS(dVar6)) || (1e-06 <= ABS(dVar1))) {
    if (0.0 <= dVar1) {
      local_38 = (this->super_Vector<double,_4U>).data_[1];
      dStack_30 = (this->super_Vector<double,_4U>).data_[2];
    }
    else {
      dVar1 = -dVar1;
      local_38 = -(this->super_Vector<double,_4U>).data_[1];
      dStack_30 = -(this->super_Vector<double,_4U>).data_[2];
      dVar6 = -dVar6;
    }
    __x = atan2(dVar6,dVar1);
    dVar1 = atan2(SQRT(local_38 * local_38 + dStack_30 * dStack_30),
                  SQRT(dVar6 * dVar6 + dVar1 * dVar1));
    dVar6 = sin(dVar1);
    dVar2 = 0.0;
    dVar5 = 0.0;
    if (1e-06 <= ABS(dVar6)) {
      dVar2 = sin(__x);
      dVar5 = cos(__x);
      auVar3._8_8_ = dVar5 * local_38 + dVar2 * dStack_30;
      auVar3._0_8_ = dVar2 * -local_38 + dVar5 * dStack_30;
      auVar4._8_4_ = SUB84(dVar6,0);
      auVar4._0_8_ = dVar6;
      auVar4._12_4_ = (int)((ulong)dVar6 >> 0x20);
      auVar4 = divpd(auVar3,auVar4);
      dVar2 = auVar4._0_8_ + auVar4._0_8_;
      dVar5 = auVar4._8_8_ + auVar4._8_8_;
    }
    *tw = __x + __x;
    *sx = dVar5 * dVar1;
    *sy = dVar1 * dVar2;
  }
  else {
    *sy = 3.141592653589793;
    *sx = 3.141592653589793;
    *tw = 0.0;
  }
  return;
}

Assistant:

void toTwistSwing(Real& tw, Real& sx, Real& sy) {
      // First test if the swing is in the singularity:

      if (ISZERO(z(), tiny) && ISZERO(w(), tiny)) {
        sx = sy = Constants::PI;
        tw      = 0;
        return;
      }

      // Decompose into twist-swing by solving the equation:
      //
      //                       Qtwist(t*2) * Qswing(s*2) = q
      //
      // note: (x,y) is the normalized swing axis (x*x+y*y=1)
      //
      //          ( Ct 0 0 St ) * ( Cs xSs ySs 0 ) = ( qw qx qy qz )
      //  ( CtCs  xSsCt-yStSs  xStSs+ySsCt  StCs ) = ( qw qx qy qz )      (1)
      // From (1): CtCs / StCs = qw/qz => Ct/St = qw/qz => tan(t) = qz/qw (2)
      //
      // The swing rotation/2 s comes from:
      //
      // From (1): (CtCs)^2 + (StCs)^2 = qw^2 + qz^2 =>
      //                                       Cs = sqrt ( qw^2 + qz^2 ) (3)
      //
      // From (1): (xSsCt-yStSs)^2 + (xStSs+ySsCt)^2 = qx^2 + qy^2 =>
      //                                       Ss = sqrt ( qx^2 + qy^2 ) (4)
      // From (1):  |SsCt -StSs| |x| = |qx|
      //            |StSs +SsCt| |y|   |qy|                              (5)

      Real qw, qx, qy, qz;

      if (w() < 0) {
        qw = -w();
        qx = -x();
        qy = -y();
        qz = -z();
      } else {
        qw = w();
        qx = x();
        qy = y();
        qz = z();
      }

      Real t = atan2(qz, qw);  // from (2)
      Real s =
          atan2(sqrt(qx * qx + qy * qy), sqrt(qz * qz + qw * qw));  // from (3)
                                                                    // and (4)

      Real x = 0.0, y = 0.0, sins = sin(s);

      if (!ISZERO(sins, tiny)) {
        Real sint = sin(t);
        Real cost = cos(t);

        // by solving the linear system in (5):
        y = (-qx * sint + qy * cost) / sins;
        x = (qx * cost + qy * sint) / sins;
      }

      tw = (Real)2.0 * t;
      sx = (Real)2.0 * x * s;
      sy = (Real)2.0 * y * s;
    }